

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  PyNumberMethods *pPVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  function_record *pfVar4;
  long lVar5;
  function_record *pfVar6;
  bool bVar7;
  uint __val;
  uint uVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  PyTypeObject *pPVar13;
  type_info *ptVar14;
  detail *pdVar15;
  undefined8 *puVar16;
  long *plVar17;
  function_record *pfVar18;
  PyMethodDef *pPVar19;
  object *poVar20;
  PyObject *pPVar21;
  PyObject *pPVar22;
  error_already_set *this_00;
  ushort uVar23;
  ulong uVar24;
  ulong *puVar25;
  size_type *psVar26;
  function_record *pfVar27;
  handle *handle;
  handle *handle_00;
  handle *handle_01;
  handle *handle_02;
  long lVar28;
  PyTypeObject *pPVar29;
  char cVar30;
  undefined8 uVar31;
  PyNumberMethods *pPVar32;
  uint __len;
  ulong uVar33;
  uint uVar34;
  PyTypeObject *pPVar35;
  PyMethodDef *pPVar36;
  undefined1 auVar37 [16];
  string signatures;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  handle local_118;
  PyObject *local_110;
  undefined1 local_108 [40];
  PyTypeObject *pPStack_e0;
  getattrofunc local_d8;
  setattrofunc local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  strdup_guard local_b8;
  PySequenceMethods *local_a0;
  PyMappingMethods *local_98;
  unique_function_record *local_90;
  ternaryfunc local_88;
  PyMethodDef *local_80;
  PyMemberDef *local_78;
  accessor<pybind11::detail::accessor_policies::str_attr> local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar4 = (unique_rec->_M_t).
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar12 = "";
  if (pfVar4->name != (char *)0x0) {
    pcVar12 = pfVar4->name;
  }
  local_98 = (PyMappingMethods *)types;
  local_78 = (PyMemberDef *)args;
  pcVar12 = strdup_guard::operator()(&local_b8,pcVar12);
  pfVar4->name = pcVar12;
  if (pfVar4->doc != (char *)0x0) {
    pcVar12 = strdup_guard::operator()(&local_b8,pfVar4->doc);
    pfVar4->doc = pcVar12;
  }
  pPVar29 = *(PyTypeObject **)
             &(pfVar4->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data;
  pPVar35 = *(PyTypeObject **)
             ((long)&(pfVar4->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             + 8);
  local_90 = unique_rec;
  local_80 = (PyMethodDef *)this;
  if (pPVar29 != pPVar35) {
    do {
      pcVar12 = (char *)(pPVar29->ob_base).ob_base.ob_refcnt;
      if (pcVar12 != (char *)0x0) {
        pcVar12 = strdup_guard::operator()(&local_b8,pcVar12);
        (pPVar29->ob_base).ob_base.ob_refcnt = (Py_ssize_t)pcVar12;
      }
      pPVar13 = (pPVar29->ob_base).ob_base.ob_type;
      if (pPVar13 == (PyTypeObject *)0x0) {
        if ((pPVar29->ob_base).ob_size != 0) {
          auVar37 = PyObject_Repr();
          if (auVar37._0_8_ == (getattrofunc)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_d8 = auVar37._0_8_;
          cast<std::__cxx11::string>
                    ((enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_178,(pybind11 *)&local_d8,auVar37._8_8_);
          pPVar13 = (PyTypeObject *)strdup_guard::operator()(&local_b8,(char *)local_178._0_8_);
          (pPVar29->ob_base).ob_base.ob_type = pPVar13;
          if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)local_168) {
            operator_delete((void *)local_178._0_8_,(ulong)(local_168._0_8_ + 1));
          }
          object::~object((object *)&local_d8);
        }
      }
      else {
        pPVar13 = (PyTypeObject *)strdup_guard::operator()(&local_b8,(char *)pPVar13);
        (pPVar29->ob_base).ob_base.ob_type = pPVar13;
      }
      pPVar29 = (PyTypeObject *)&pPVar29->tp_basicsize;
    } while (pPVar29 != pPVar35);
  }
  pcVar12 = pfVar4->name;
  iVar10 = strcmp(pcVar12,"__init__");
  if (iVar10 == 0) {
    uVar23 = 1;
  }
  else {
    iVar10 = strcmp(pcVar12,"__setstate__");
    uVar23 = (ushort)(iVar10 == 0);
  }
  local_a0 = (PySequenceMethods *)&pfVar4->args;
  *(ushort *)&pfVar4->field_0x59 = uVar23 | *(ushort *)&pfVar4->field_0x59 & 0xfffe;
  local_d8 = (getattrofunc)&local_c8;
  local_d0 = (setattrofunc)0x0;
  local_c8 = (_func_PyObject_ptr_PyObject_ptr_PyObject_ptr)0x0;
  local_88 = (ternaryfunc)local_168;
  bVar7 = false;
  pPVar35 = (PyTypeObject *)0x0;
  lVar28 = 0;
  do {
    bVar3 = *text;
    if (bVar3 < 0x7b) {
      if (bVar3 == 0x25) {
        pPVar29 = (PyTypeObject *)(&local_98->mp_length)[lVar28];
        if (pPVar29 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_178._0_8_ = pPVar29;
        ptVar14 = detail::get_type_info((type_index *)local_178,false);
        lVar28 = lVar28 + 1;
        if (ptVar14 == (type_info *)0x0) {
          if (((pfVar4->field_0x59 & 2) == 0) || (pPVar35 != (PyTypeObject *)0x0)) {
            pPVar13 = (pPVar29->ob_base).ob_base.ob_type;
            std::__cxx11::string::string
                      ((string *)local_178,
                       (char *)((long)&(pPVar13->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar13->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator *)(local_168 + 0x10));
            detail::clean_type_id((string *)local_178);
            std::__cxx11::string::_M_append((char *)&local_d8,local_178._0_8_);
            if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)local_168) {
              operator_delete((void *)local_178._0_8_,(ulong)(local_168._0_8_ + 1));
            }
            goto LAB_001bd232;
          }
          local_50.obj.m_ptr = (pfVar4->scope).m_ptr;
          local_50.key = "__module__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              (&local_50);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_178,pdVar15,handle_00);
          local_118.m_ptr = (PyObject *)local_108;
          paVar2 = &local_138.field_2;
          if ((PyTypeObject *)local_178._0_8_ == (PyTypeObject *)local_168) {
            local_108._8_8_ = local_168._8_8_;
          }
          else {
            local_118.m_ptr = (PyObject *)local_178._0_8_;
          }
          local_108._0_8_ = local_168._0_8_;
          local_110 = (PyObject *)local_178._8_8_;
          plVar17 = (long *)std::__cxx11::string::append((char *)&local_118);
          puVar25 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_138.field_2._M_allocated_capacity = *puVar25;
            local_138.field_2._8_8_ = plVar17[3];
            local_138._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar25;
            local_138._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_138._M_string_length = plVar17[1];
          *plVar17 = (long)puVar25;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          local_70.obj.m_ptr = (pfVar4->scope).m_ptr;
          local_70.key = "__qualname__";
          local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              (&local_70);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_178,pdVar15,handle_02);
          local_108._16_8_ = local_178._0_8_;
          if ((PyTypeObject *)local_178._0_8_ == (PyTypeObject *)local_168) {
            pPStack_e0 = (PyTypeObject *)local_168._8_8_;
            local_108._16_8_ = (PyTypeObject *)(local_108 + 0x20);
          }
          local_108._32_8_ = local_168._0_8_;
          local_108._24_8_ = local_178._8_8_;
          uVar31 = (PyNumberMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar2) {
            uVar31 = local_138.field_2._M_allocated_capacity;
          }
          pPVar1 = (PyNumberMethods *)
                   ((long)(Py_ssize_t *)local_178._8_8_ + local_138._M_string_length);
          if ((ulong)uVar31 < pPVar1) {
            pPVar32 = (PyNumberMethods *)0xf;
            if ((PyTypeObject *)local_108._16_8_ != (PyTypeObject *)(local_108 + 0x20)) {
              pPVar32 = (PyNumberMethods *)local_168._0_8_;
            }
            if (pPVar32 < pPVar1) goto LAB_001bd022;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)(local_108 + 0x10),0,(char *)0x0,
                                 (ulong)local_138._M_dataplus._M_p);
          }
          else {
LAB_001bd022:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_138,local_108._16_8_);
          }
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar26 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar26) {
            local_158.field_2._M_allocated_capacity = *psVar26;
            local_158.field_2._8_8_ = puVar16[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar26;
            local_158._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_158._M_string_length = puVar16[1];
          *puVar16 = psVar26;
          puVar16[1] = 0;
          *(undefined1 *)psVar26 = 0;
          std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_108._16_8_ != (PyTypeObject *)(local_108 + 0x20)) {
            operator_delete((void *)local_108._16_8_,
                            (ulong)((long)(binaryfunc *)local_108._32_8_ + 1));
          }
          object::~object(&local_70.cache);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar2) {
            operator_delete(local_138._M_dataplus._M_p,
                            (ulong)(local_138.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_118.m_ptr != (PyTypeObject *)local_108) {
            operator_delete(local_118.m_ptr,(ulong)((long)(binaryfunc *)local_108._0_8_ + 1));
          }
          object::~object(&local_50.cache);
          pPVar35 = (PyTypeObject *)0x0;
        }
        else {
          pPVar29 = ptVar14->type;
          local_50.key = "__module__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_50.obj.m_ptr = (PyObject *)pPVar29;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              (&local_50);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_178,pdVar15,handle);
          local_118.m_ptr = (PyObject *)local_108;
          if ((PyTypeObject *)local_178._0_8_ == (PyTypeObject *)local_168) {
            local_108._8_8_ = local_168._8_8_;
          }
          else {
            local_118.m_ptr = (PyObject *)local_178._0_8_;
          }
          local_108._0_8_ = local_168._0_8_;
          local_110 = (PyObject *)local_178._8_8_;
          plVar17 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          puVar25 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_138.field_2._M_allocated_capacity = *puVar25;
            local_138.field_2._8_8_ = plVar17[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar25;
            local_138._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_138._M_string_length = plVar17[1];
          *plVar17 = (long)puVar25;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          local_70.key = "__qualname__";
          local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_70.obj.m_ptr = (PyObject *)pPVar29;
          pdVar15 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              (&local_70);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_178,pdVar15,handle_01);
          local_108._16_8_ = local_178._0_8_;
          if ((PyTypeObject *)local_178._0_8_ == (PyTypeObject *)local_168) {
            pPStack_e0 = (PyTypeObject *)local_168._8_8_;
            local_108._16_8_ = (PyTypeObject *)(local_108 + 0x20);
          }
          local_108._32_8_ = local_168._0_8_;
          local_108._24_8_ = local_178._8_8_;
          uVar31 = (PyNumberMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar31 = local_138.field_2._M_allocated_capacity;
          }
          pPVar1 = (PyNumberMethods *)
                   ((long)(Py_ssize_t *)local_178._8_8_ + local_138._M_string_length);
          if ((ulong)uVar31 < pPVar1) {
            pPVar32 = (PyNumberMethods *)0xf;
            if ((PyTypeObject *)local_108._16_8_ != (PyTypeObject *)(local_108 + 0x20)) {
              pPVar32 = (PyNumberMethods *)local_168._0_8_;
            }
            if (pPVar32 < pPVar1) goto LAB_001bcd72;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)(local_108 + 0x10),0,(char *)0x0,
                                 (ulong)local_138._M_dataplus._M_p);
          }
          else {
LAB_001bcd72:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_138,local_108._16_8_);
          }
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar26 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar26) {
            local_158.field_2._M_allocated_capacity = *psVar26;
            local_158.field_2._8_8_ = puVar16[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar26;
            local_158._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_158._M_string_length = puVar16[1];
          *puVar16 = psVar26;
          puVar16[1] = 0;
          *(undefined1 *)psVar26 = 0;
          std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_158._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_108._16_8_ != (PyTypeObject *)(local_108 + 0x20)) {
            operator_delete((void *)local_108._16_8_,
                            (ulong)((long)(binaryfunc *)local_108._32_8_ + 1));
          }
          object::~object(&local_70.cache);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,
                            (ulong)(local_138.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_118.m_ptr != (PyTypeObject *)local_108) {
            operator_delete(local_118.m_ptr,(ulong)((long)(binaryfunc *)local_108._0_8_ + 1));
          }
          object::~object(&local_50.cache);
        }
      }
      else {
        if (bVar3 == 0) break;
LAB_001bcb81:
        std::__cxx11::string::push_back((char)&local_d8);
      }
    }
    else if (bVar3 == 0x7b) {
      bVar7 = true;
      if (((byte *)text)[1] != 0x2a) {
        if (((pfVar4->field_0x59 & 0x40) == 0) &&
           (pPVar35 == (PyTypeObject *)(ulong)pfVar4->nargs_pos)) {
          std::__cxx11::string::append((char *)&local_d8);
        }
        lVar5 = *(long *)&(pfVar4->args).
                          super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          ._M_impl.super__Vector_impl_data;
        if (((pPVar35 < (PyTypeObject *)
                        ((long)*(pointer *)
                                ((long)&(pfVar4->args).
                                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                + 8) - lVar5 >> 5)) &&
            (*(long *)(lVar5 + (long)pPVar35 * 0x20) != 0)) ||
           ((*(ushort *)&pfVar4->field_0x59 & 0x10) != 0 && pPVar35 == (PyTypeObject *)0x0)) {
          std::__cxx11::string::append((char *)&local_d8);
        }
        else {
          uVar33 = (long)pPVar35 - (ulong)((*(ushort *)&pfVar4->field_0x59 >> 4 & 1) != 0);
          cVar30 = '\x01';
          if (9 < uVar33) {
            uVar24 = uVar33;
            cVar9 = '\x04';
            do {
              cVar30 = cVar9;
              if (uVar24 < 100) {
                cVar30 = cVar30 + -2;
                goto LAB_001bd141;
              }
              if (uVar24 < 1000) {
                cVar30 = cVar30 + -1;
                goto LAB_001bd141;
              }
              if (uVar24 < 10000) goto LAB_001bd141;
              bVar7 = 99999 < uVar24;
              uVar24 = uVar24 / 10000;
              cVar9 = cVar30 + '\x04';
            } while (bVar7);
            cVar30 = cVar30 + '\x01';
          }
LAB_001bd141:
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct((ulong)(local_168 + 0x10),cVar30);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_158._M_dataplus._M_p,(uint)local_158._M_string_length,uVar33);
          plVar17 = (long *)std::__cxx11::string::replace
                                      ((ulong)(local_168 + 0x10),0,(char *)0x0,0x2730a0);
          local_178._0_8_ = local_168;
          pPVar13 = (PyTypeObject *)(plVar17 + 2);
          if ((PyTypeObject *)*plVar17 == pPVar13) {
            local_168._0_8_ = (pPVar13->ob_base).ob_base.ob_refcnt;
            local_168._8_8_ = plVar17[3];
          }
          else {
            local_168._0_8_ = (pPVar13->ob_base).ob_base.ob_refcnt;
            local_178._0_8_ = (PyTypeObject *)*plVar17;
          }
          local_178._8_8_ = plVar17[1];
          *plVar17 = (long)pPVar13;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_d8,local_178._0_8_);
          if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)local_168) {
            operator_delete((void *)local_178._0_8_,(ulong)(local_168._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_d8);
        bVar7 = false;
      }
    }
    else {
      if (bVar3 != 0x7d) goto LAB_001bcb81;
      if (((!bVar7) &&
          (lVar5 = *(long *)&(pfVar4->args).
                             super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                             ._M_impl.super__Vector_impl_data,
          pPVar35 < (PyTypeObject *)
                    ((long)*(pointer *)
                            ((long)&(pfVar4->args).
                                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                            + 8) - lVar5 >> 5))) &&
         (*(long *)(lVar5 + 8 + (long)pPVar35 * 0x20) != 0)) {
        std::__cxx11::string::append((char *)&local_d8);
        std::__cxx11::string::append((char *)&local_d8);
      }
      pPVar29 = (PyTypeObject *)((long)&(pPVar35->ob_base).ob_base.ob_refcnt + 1);
      if (((PyTypeObject *)(ulong)pfVar4->nargs_pos_only != (PyTypeObject *)0x0) &&
         (pPVar29 == (PyTypeObject *)(ulong)pfVar4->nargs_pos_only)) {
        std::__cxx11::string::append((char *)&local_d8);
      }
      if (!bVar7) {
        pPVar35 = pPVar29;
      }
    }
LAB_001bd232:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((pPVar35 !=
       (PyTypeObject *)
       (local_78 +
       (-(ulong)((*(ushort *)&pfVar4->field_0x59 >> 7 & 1) != 0) -
       (ulong)(*(ushort *)&pfVar4->field_0x59 >> 6 & 1)))) ||
     ((type_info *)(&local_98->mp_length)[lVar28] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar12 = strdup_guard::operator()(&local_b8,(char *)local_d8);
  pPVar36 = local_80;
  pfVar4->signature = pcVar12;
  if (*(pointer *)
       ((long)&(pfVar4->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
       + 0x10) !=
      *(pointer *)
       ((long)&(pfVar4->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
       + 8)) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)local_a0);
  }
  pfVar4->nargs = (uint16_t)local_78;
  pPVar21 = (pfVar4->sibling).m_ptr;
  if (pPVar21 == (PyObject *)0x0) {
LAB_001bd395:
    pPVar19 = (PyMethodDef *)operator_new(0x20);
    pfVar4->def = pPVar19;
    *(undefined8 *)&pPVar19->ml_flags = 0;
    pPVar19->ml_doc = (char *)0x0;
    pPVar19->ml_name = pfVar4->name;
    pPVar19->ml_meth = dispatcher;
    pPVar19->ml_flags = 3;
    pfVar18 = (local_90->_M_t).
              super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              ._M_t.
              super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
    (local_90->_M_t).
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         (function_record *)0x0;
    capsule::capsule((capsule *)(local_168 + 0x10),pfVar18,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    capsule::set_name((capsule *)(local_168 + 0x10),(char *)0x0);
    if (local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_138._M_dataplus._M_p = (pointer)0x0;
    pPVar21 = (pfVar4->scope).m_ptr;
    if (pPVar21 != (PyObject *)0x0) {
      iVar10 = PyObject_HasAttrString(pPVar21,"__module__");
      if (iVar10 == 1) {
        local_178._8_8_ = (pfVar4->scope).m_ptr;
        local_168._0_8_ = "__module__";
        local_168._8_8_ = (PyTypeObject *)0x0;
        poVar20 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_178);
      }
      else {
        iVar10 = PyObject_HasAttrString((pfVar4->scope).m_ptr,"__name__");
        if (iVar10 != 1) goto LAB_001bd4de;
        local_178._8_8_ = (pfVar4->scope).m_ptr;
        local_168._0_8_ = "__name__";
        local_168._8_8_ = (PyTypeObject *)0x0;
        poVar20 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_178);
      }
      local_118.m_ptr = (poVar20->super_handle).m_ptr;
      if ((PyTypeObject *)local_118.m_ptr != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_118.m_ptr)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_118.m_ptr)->ob_base).ob_base.ob_refcnt + 1;
      }
      object::operator=((object *)&local_138,(object *)&local_118);
      object::~object((object *)&local_118);
      object::~object((object *)(local_168 + 8));
    }
LAB_001bd4de:
    pPVar21 = (PyObject *)
              PyCMethod_New(pfVar4->def,local_158._M_dataplus._M_p,local_138._M_dataplus._M_p,0);
    (((function *)&pPVar36->ml_name)->super_object).super_handle.m_ptr = pPVar21;
    if (pPVar21 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    object::~object((object *)&local_138);
    object::~object((object *)(local_168 + 0x10));
    local_178._0_8_ = local_168;
    local_178._8_8_ = (PyObject *)0x0;
    local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
    uVar33 = CONCAT71((int7)((ulong)pPVar29 >> 8),1);
    pfVar18 = pfVar4;
    local_88 = (ternaryfunc)local_178._0_8_;
  }
  else {
    if (pPVar21->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar21 = (PyObject *)pPVar21[1].ob_refcnt;
      (pfVar4->sibling).m_ptr = pPVar21;
      if (pPVar21 == (PyObject *)0x0) goto LAB_001bd395;
    }
    if (pPVar21->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar10 = PyType_IsSubtype(pPVar21->ob_type,&PyCFunction_Type);
      pPVar21 = (pfVar4->sibling).m_ptr;
      if (iVar10 == 0) {
        if ((pPVar21 != (PyObject *)&_Py_NoneStruct) && (*pfVar4->name != '_')) {
          std::__cxx11::string::string((string *)&local_138,pfVar4->name,(allocator *)&local_118);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_168 + 0x10),"Cannot overload existing non-function object \"",
                         &local_138);
          plVar17 = (long *)std::__cxx11::string::append(local_168 + 0x10);
          local_178._0_8_ = *plVar17;
          psVar26 = (size_type *)(plVar17 + 2);
          if ((size_type *)local_178._0_8_ == psVar26) {
            local_168._0_8_ = *psVar26;
            local_168._8_8_ = plVar17[3];
            local_178._0_8_ = local_168;
          }
          else {
            local_168._0_8_ = *psVar26;
          }
          local_178._8_8_ = plVar17[1];
          *plVar17 = (long)psVar26;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          pybind11_fail((string *)local_178);
        }
        goto LAB_001bd395;
      }
    }
    if ((((*(byte *)(pPVar21[1].ob_refcnt + 0x10) & 0x20) != 0) ||
        (pPVar35 = pPVar21[1].ob_type, pPVar35 == (PyTypeObject *)0x0)) ||
       ((pPVar35->ob_base).ob_base.ob_type != (PyTypeObject *)&PyCapsule_Type)) goto LAB_001bd395;
    (pPVar35->ob_base).ob_base.ob_refcnt = (pPVar35->ob_base).ob_base.ob_refcnt + 1;
    local_178._0_8_ = pPVar35;
    pcVar12 = capsule::name((capsule *)local_178);
    if ((pcVar12 != (char *)0x0) ||
       (pfVar18 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_178),
       (pfVar18->scope).m_ptr != (pfVar4->scope).m_ptr)) {
      object::~object((object *)local_178);
      goto LAB_001bd395;
    }
    object::~object((object *)local_178);
    pPVar21 = (pfVar4->sibling).m_ptr;
    (((function *)&pPVar36->ml_name)->super_object).super_handle.m_ptr = pPVar21;
    if (pPVar21 != (PyObject *)0x0) {
      pPVar21->ob_refcnt = pPVar21->ob_refcnt + 1;
    }
    if (((*(ushort *)&pfVar18->field_0x59 ^ *(ushort *)&pfVar4->field_0x59) & 0x10) != 0) {
      pybind11_fail(
                   "overloading a method with both static and instance methods is not supported; #define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more details"
                   );
    }
    pfVar6 = pfVar18;
    if ((*(ushort *)&pfVar4->field_0x59 >> 8 & 1) == 0) {
      do {
        pfVar27 = pfVar6;
        pfVar6 = pfVar27->next;
      } while (pfVar6 != (function_record *)0x0);
      pfVar6 = (local_90->_M_t).
               super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
               ._M_t.
               super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
               .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      (local_90->_M_t).
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           (function_record *)0x0;
      pfVar27->next = pfVar6;
      if (local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    else {
      pfVar4->next = pfVar18;
      local_178._0_8_ = pPVar21[1].ob_type;
      if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_178._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_178._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
      pfVar18 = (local_90->_M_t).
                super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                ._M_t.
                super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      (local_90->_M_t).
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           (function_record *)0x0;
      capsule::set_pointer((capsule *)local_178,pfVar18);
      if (local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      object::~object((object *)local_178);
      pfVar18 = pfVar4;
    }
    local_178._0_8_ = local_168;
    local_178._8_8_ = (PyObject *)0x0;
    local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
    if (DAT_00320ba9 == 1) {
      std::__cxx11::string::append(local_178);
      std::__cxx11::string::append(local_178);
      std::__cxx11::string::append(local_178);
    }
    if (pfVar18 == (function_record *)0x0) goto LAB_001bd783;
    uVar33 = 0;
  }
  uVar34 = 0;
  uVar24 = CONCAT71((int7)((ulong)text >> 8),1);
  local_a0 = (PySequenceMethods *)CONCAT44(local_a0._4_4_,(int)uVar33);
  do {
    if (DAT_00320ba9 == 1) {
      if (0 < (int)uVar34) {
        std::__cxx11::string::push_back((char)local_178);
      }
      if ((char)uVar33 == '\0') {
        local_98 = (PyMappingMethods *)CONCAT44(local_98._4_4_,(int)uVar24);
        uVar34 = uVar34 + 1;
        __val = -uVar34;
        if (0 < (int)uVar34) {
          __val = uVar34;
        }
        __len = 1;
        if (9 < __val) {
          uVar33 = (ulong)__val;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar11 = (uint)uVar33;
            if (uVar11 < 100) {
              __len = __len - 2;
              goto LAB_001bd5e3;
            }
            if (uVar11 < 1000) {
              __len = __len - 1;
              goto LAB_001bd5e3;
            }
            if (uVar11 < 10000) goto LAB_001bd5e3;
            uVar33 = uVar33 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar11);
          __len = __len + 1;
        }
LAB_001bd5e3:
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_138,(char)__len - (char)((int)uVar34 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_138._M_dataplus._M_p + (uVar34 >> 0x1f),__len,__val);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar26 = puVar16 + 2;
        uVar33 = (ulong)local_a0 & 0xffffffff;
        uVar24 = (ulong)local_98 & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar26) {
          local_158.field_2._M_allocated_capacity = *psVar26;
          local_158.field_2._8_8_ = puVar16[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar26;
          local_158._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_158._M_string_length = puVar16[1];
        *puVar16 = psVar26;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::__cxx11::string::_M_append(local_178,(ulong)local_158._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::append(local_178);
      std::__cxx11::string::append(local_178);
      std::__cxx11::string::push_back((char)local_178);
    }
    if (((pfVar18->doc != (char *)0x0) && (*pfVar18->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      cVar30 = (char)local_178;
      if (((DAT_00320ba9 | (byte)uVar24) & 1) == 0) {
        std::__cxx11::string::push_back(cVar30);
        uVar24 = 0;
      }
      else {
        uVar24 = CONCAT71((int7)(uVar24 >> 8),(byte)uVar24 & DAT_00320ba9);
      }
      if ((DAT_00320ba9 & 1) != 0) {
        std::__cxx11::string::push_back(cVar30);
      }
      std::__cxx11::string::append(local_178);
      if (DAT_00320ba9 == 1) {
        std::__cxx11::string::push_back(cVar30);
      }
    }
    pfVar18 = pfVar18->next;
    pPVar36 = local_80;
  } while (pfVar18 != (function_record *)0x0);
LAB_001bd783:
  pPVar21 = (((function *)&pPVar36->ml_name)->super_object).super_handle.m_ptr;
  free(*(void **)(pPVar21[1].ob_refcnt + 0x18));
  if ((PyObject *)local_178._8_8_ == (PyObject *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    pcVar12 = strdup((char *)local_178._0_8_);
  }
  *(char **)(pPVar21[1].ob_refcnt + 0x18) = pcVar12;
  if ((pfVar4->field_0x59 & 0x10) != 0) {
    pPVar22 = (PyObject *)
              PyInstanceMethod_New
                        ((((function *)&pPVar36->ml_name)->super_object).super_handle.m_ptr);
    (((function *)&pPVar36->ml_name)->super_object).super_handle.m_ptr = pPVar22;
    if (pPVar22 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    pPVar21->ob_refcnt = pPVar21->ob_refcnt + -1;
    if (pPVar21->ob_refcnt == 0) {
      _Py_Dealloc(pPVar21);
    }
  }
  if ((ternaryfunc)local_178._0_8_ != local_88) {
    operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
  }
  if (local_d8 != (getattrofunc)&local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  strdup_guard::~strdup_guard(&local_b8);
  return;
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            rec_capsule.set_name(detail::get_function_record_capsule_name());
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }